

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_protection(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  sn_00 = skill_lookup("protection");
  bVar1 = is_affected(ch,sn_00);
  if (bVar1) {
    send_to_char("You are already protected.\n\r",ch);
    return;
  }
  init_affect(&AStack_88);
  AStack_88.where = 0;
  AStack_88.aftype = get_spell_aftype(ch);
  AStack_88.type = (short)sn;
  AStack_88.level = (short)level;
  AStack_88.duration = (short)((uint)(level - (level >> 0x1f)) >> 1);
  AStack_88.modifier = 0;
  AStack_88.mod_name = 8;
  AStack_88.bitvector[0]._1_1_ = AStack_88.bitvector[0]._1_1_ | 0x20;
  affect_to_char(ch,&AStack_88);
  send_to_char("You feel protected.\n\r",ch);
  return;
}

Assistant:

void spell_protection(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, skill_lookup("protection")))
	{
		send_to_char("You are already protected.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 2;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_PROTECTION);

	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You feel protected.\n\r", ch);
}